

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadPool.h
# Opt level: O0

void __thiscall depspawn::internal::ThreadPool::~ThreadPool(ThreadPool *this)

{
  bool bVar1;
  iterator this_00;
  void *in_RSI;
  ThreadPool *in_RDI;
  thread *thread;
  iterator __end2;
  iterator __begin2;
  vector<std::thread,_std::allocator<std::thread>_> *__range2;
  vector<std::thread,_std::allocator<std::thread>_> *in_stack_ffffffffffffffc8;
  __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
  local_18 [3];
  
  wait(in_RDI,in_RSI);
  in_RDI->finish_ = true;
  launch_theads(in_RDI);
  local_18[0]._M_current =
       (thread *)
       std::vector<std::thread,_std::allocator<std::thread>_>::begin(in_stack_ffffffffffffffc8);
  this_00 = std::vector<std::thread,_std::allocator<std::thread>_>::end(in_stack_ffffffffffffffc8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
                        *)in_RDI,
                       (__normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
                        *)in_stack_ffffffffffffffc8);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>::
    operator*(local_18);
    std::thread::join();
    __gnu_cxx::
    __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>::
    operator++(local_18);
  }
  std::function<void_()>::~function((function<void_()> *)0x13233f);
  std::condition_variable::~condition_variable(&in_RDI->cond_var_);
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector
            ((vector<std::thread,_std::allocator<std::thread>_> *)this_00._M_current);
  return;
}

Assistant:

~ThreadPool()
  {
    wait();
    
    finish_ = true;
    launch_theads();
    for (auto& thread : threads_) {
      thread.join();
    }
  }